

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmpfile.c
# Opt level: O2

int main(void)

{
  int iVar1;
  FILE *__stream;
  
  __stream = tmpfile();
  if (__stream == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x76,"( fh = tmpfile() ) != NULL");
  }
  iVar1 = fputc(0x78,__stream);
  if (iVar1 != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x77,"fputc( \'x\', fh ) == \'x\'");
  }
  iVar1 = fclose(__stream);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x7d,"fclose( fh ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    FILE * fh;
#ifndef REGTEST
    char filename[ L_tmpnam ];
    FILE * fhtest;
#endif
    TESTCASE( ( fh = tmpfile() ) != NULL );
    TESTCASE( fputc( 'x', fh ) == 'x' );
    /* Checking that file is actually there */
    TESTCASE_NOREG( strcpy( filename, fh->filename ) == filename );
    TESTCASE_NOREG( ( fhtest = fopen( filename, "r" ) ) != NULL );
    TESTCASE_NOREG( fclose( fhtest ) == 0 );
    /* Closing tmpfile */
    TESTCASE( fclose( fh ) == 0 );
    /* Checking that file was deleted */
    TESTCASE_NOREG( fopen( filename, "r" ) == NULL );
    return TEST_RESULTS;
}